

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O1

DispatchCallResult __thiscall
capnp::DynamicCapability::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  uint index;
  Reader RVar3;
  DispatchCallResult DVar4;
  Method method;
  NullableValue<capnp::InterfaceSchema> _interface61;
  StructSchema resultType;
  MethodList methods;
  Method local_130;
  Schema SStack_e8;
  RawBrandedSchema *local_e0;
  char local_d8;
  Schema local_d0;
  RawBrandedSchema *local_c8;
  undefined8 uStack_c0;
  SegmentReader *local_b8;
  WirePointer *pWStack_b0;
  StructDataBitCount local_98;
  StructPointerCount SStack_94;
  undefined2 uStack_92;
  int iStack_90;
  undefined4 uStack_8c;
  PointerReader local_88;
  MethodList local_68;
  
  InterfaceSchema::findSuperclass(&local_130.parent,interfaceId + 0x10);
  local_d8 = (char)local_130.parent.super_Schema.raw;
  if ((char)local_130.parent.super_Schema.raw == '\0') {
    Schema::getProto((Reader *)&local_130,(Schema *)(interfaceId + 0x10));
    if (local_130.proto._reader.data._4_2_ == 0) {
      local_130.proto._reader.pointers._0_4_ = 0x7fffffff;
      local_68.list.reader.segment = (SegmentReader *)0x0;
      local_130.proto._reader.capTable = (CapTableReader *)0x0;
      local_130.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    }
    else {
      local_68.list.reader.segment = (SegmentReader *)CONCAT62(local_130._10_6_,local_130.ordinal);
    }
    local_68.parent.super_Schema.raw = local_130.parent.super_Schema.raw;
    local_68.list.reader.capTable = local_130.proto._reader.capTable;
    local_68.list.reader.ptr._0_4_ = (int)local_130.proto._reader.pointers;
    RVar3 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_68,(void *)0x0,0);
    DVar4 = Capability::Server::internalUnimplemented
                      (&this->super_Server,(char *)interfaceId,
                       (uint64_t)RVar3.super_StringPtr.content.ptr);
    uVar2 = DVar4._8_8_;
  }
  else {
    InterfaceSchema::getMethods(&local_68,(InterfaceSchema *)&local_d0);
    index = (uint)context.hook & 0xffff;
    if (index < local_68.list.reader.elementCount) {
      capnp::_::ListReader::getStructElement(&local_130.proto._reader,&local_68.list.reader,index);
      local_130.parent.super_Schema.raw = local_68.parent.super_Schema.raw;
      local_130.ordinal = (uint16_t)context.hook;
      local_88.segment = (SegmentReader *)InterfaceSchema::Method::getResultType(&local_130);
      uStack_c0 = CONCAT62(local_130._10_6_,local_130.ordinal);
      local_c8 = (RawBrandedSchema *)local_130.parent.super_Schema.raw;
      local_b8 = local_130.proto._reader.segment;
      pWStack_b0 = (WirePointer *)local_130.proto._reader.capTable;
      local_98 = local_130.proto._reader.dataSize;
      SStack_94 = local_130.proto._reader.pointerCount;
      uStack_92 = local_130.proto._reader._38_2_;
      iStack_90 = local_130.proto._reader.nestingLimit;
      uStack_8c = local_130.proto._reader._44_4_;
      SStack_e8.raw = (RawBrandedSchema *)InterfaceSchema::Method::getParamType(&local_130);
      local_e0 = (RawBrandedSchema *)local_88.segment;
      (**(code **)(*(long *)interfaceId + 0x18))(this,interfaceId);
      bVar1 = StructSchema::isStreamResult((StructSchema *)&local_88);
      *(bool *)&(this->super_Server).thisHook.ptr = bVar1;
      *(undefined1 *)((long)&(this->super_Server).thisHook.ptr + 1) =
           *(undefined1 *)(interfaceId + 0x18);
      uVar2 = extraout_RDX;
    }
    else {
      Schema::getProto((Reader *)&local_130,&local_d0);
      if (local_130.proto._reader.data._4_2_ == 0) {
        local_130.proto._reader.pointers._0_4_ = 0x7fffffff;
        local_88.capTable = (CapTableReader *)0x0;
        local_130.proto._reader.capTable = (CapTableReader *)0x0;
        local_130.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
      }
      else {
        local_88.capTable = (CapTableReader *)CONCAT62(local_130._10_6_,local_130.ordinal);
      }
      local_88.segment = (SegmentReader *)local_130.parent.super_Schema.raw;
      local_88.pointer = (WirePointer *)local_130.proto._reader.capTable;
      local_88.nestingLimit = (int)local_130.proto._reader.pointers;
      RVar3 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_88,(void *)0x0,0);
      DVar4 = Capability::Server::internalUnimplemented
                        (&this->super_Server,(char *)interfaceId,
                         (uint64_t)RVar3.super_StringPtr.content.ptr,methodId);
      uVar2 = DVar4._8_8_;
    }
  }
  DVar4.isStreaming = (bool)(char)uVar2;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

Capability::Server::DispatchCallResult DynamicCapability::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    CallContext<AnyPointer, AnyPointer> context) {
  KJ_IF_SOME(interface, schema.findSuperclass(interfaceId)) {
    auto methods = interface.getMethods();
    if (methodId < methods.size()) {
      auto method = methods[methodId];
      auto resultType = method.getResultType();
      return {
        call(method, CallContext<DynamicStruct, DynamicStruct>(*context.hook,
            method.getParamType(), resultType)),
        resultType.isStreamResult(),
        options.allowCancellation
      };
    } else {
      return internalUnimplemented(
          interface.getProto().getDisplayName().cStr(), interfaceId, methodId);
    }
  } else {
    return internalUnimplemented(schema.getProto().getDisplayName().cStr(), interfaceId);
  }